

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSAVEDEV(void)

{
  bool bVar1;
  int iVar2;
  int32_t badValue;
  int32_t iVar3;
  bool local_75;
  int32_t totalRam;
  int32_t start;
  aint *arg;
  aint *__end1;
  aint *__begin1;
  aint (*__range1) [3];
  path fnaam;
  aint args [3];
  bool exec;
  
  local_75 = DeviceID != (char *)0x0 && pass == 3;
  args[1]._3_1_ = local_75;
  if ((DeviceID == (char *)0x0 || pass != 3) && (pass == 3)) {
    Error("SAVEDEV only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
  }
  fnaam._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0xffffffffffffffff;
  args[0] = -1;
  GetOutputFileName_abi_cxx11_((path *)&__range1,&lp);
  for (__end1 = (aint *)&fnaam._M_cmpts; __end1 != args + 1; __end1 = __end1 + 1) {
    bVar1 = comma(&lp);
    if ((!bVar1) || (iVar2 = ParseExpression(&lp,__end1), iVar2 == 0)) {
      args[1]._3_1_ = 0;
      Error("Expected syntax SAVEDEV <filename>,<startPage>,<startOffset>,<length>",bp,SUPPRESS);
    }
  }
  if ((args[1]._3_1_ & 1) != 0) {
    if (((int)fnaam._M_cmpts._M_impl._M_t.
              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
              _M_head_impl < 0) ||
       (Device->PagesCount <=
        (int)fnaam._M_cmpts._M_impl._M_t.
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
             .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
             _M_head_impl)) {
      args[1]._3_1_ = 0;
      ErrorInt("[SAVEDEV] page number is out of range",
               (int)fnaam._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl,PASS3);
    }
    badValue = CDevice::GetMemoryOffset
                         (Device,(int)fnaam._M_cmpts._M_impl._M_t.
                                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                      .
                                      super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                      ._M_head_impl,
                          fnaam._M_cmpts._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl._4_4_);
    iVar3 = CDevice::GetMemoryOffset(Device,Device->PagesCount,0);
    if (((args[1]._3_1_ & 1) != 0) && ((badValue < 0 || (iVar3 <= badValue)))) {
      args[1]._3_1_ = 0;
      ErrorInt("[SAVEDEV] calculated start address is out of range",badValue,PASS3);
    }
    if (((args[1]._3_1_ & 1) != 0) && ((args[0] < 1 || (iVar3 < badValue + args[0])))) {
      args[1]._3_1_ = 0;
      if (args[0] == 0) {
        Warning("[SAVEDEV] zero length requested",(char *)0x0,W_PASS3);
      }
      else {
        ErrorInt("[SAVEDEV] invalid end address (bad length?)",badValue + args[0],PASS3);
      }
    }
    if (((args[1]._3_1_ & 1) != 0) &&
       (bVar1 = SaveDeviceMemory((path *)&__range1,(long)badValue,(long)args[0]), !bVar1)) {
      Error("[SAVEDEV] Error writing file (Disk full?)",bp,IF_FIRST);
    }
  }
  std::filesystem::__cxx11::path::~path((path *)&__range1);
  return;
}

Assistant:

static void dirSAVEDEV() {
	bool exec = DeviceID && LASTPASS == pass;
	if (!exec && LASTPASS == pass) Error("SAVEDEV only allowed in real device emulation mode (See DEVICE)");

	aint args[3]{-1, -1, -1};		// page, offset, length
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	for (auto & arg : args) {
		if (!comma(lp) || !ParseExpression(lp, arg)) {
			exec = false;
			Error("Expected syntax SAVEDEV <filename>,<startPage>,<startOffset>,<length>", bp, SUPPRESS);
		}
	}
	if (exec) {
		// validate arguments
		if (args[0] < 0 || Device->PagesCount <= args[0]) {
			exec = false; ErrorInt("[SAVEDEV] page number is out of range", args[0]);
		}
		const int32_t start = Device->GetMemoryOffset(args[0], args[1]);
		const int32_t totalRam = Device->GetMemoryOffset(Device->PagesCount, 0);
		if (exec && (start < 0 || totalRam <= start)) {
			exec = false; ErrorInt("[SAVEDEV] calculated start address is out of range", start);
		}
		if (exec && (args[2] <= 0 || totalRam < start + args[2])) {
			exec = false;
			if (args[2]) ErrorInt("[SAVEDEV] invalid end address (bad length?)", start + args[2]);
			else Warning("[SAVEDEV] zero length requested");
		}
		if (exec && !SaveDeviceMemory(fnaam, (size_t)start, (size_t)args[2])) {
			Error("[SAVEDEV] Error writing file (Disk full?)", bp, IF_FIRST);
		}
	}
}